

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O0

TValue * lj_meta_comp(lua_State *L,cTValue *o1,cTValue *o2,int op)

{
  int32_t iVar1;
  undefined4 uVar2;
  int iVar3;
  code *pcVar4;
  cTValue *pcVar5;
  TValue *pTVar6;
  uint in_ECX;
  cTValue *in_RDX;
  cTValue *in_RSI;
  lua_State *in_RDI;
  bool bVar7;
  cTValue *ot;
  cTValue *mo2;
  cTValue *mo_1;
  MMS mm_1;
  ASMFunction cont_1;
  int32_t res;
  cTValue *mo;
  MMS mm;
  ASMFunction cont;
  uint local_84;
  cTValue *in_stack_ffffffffffffff90;
  cTValue *in_stack_ffffffffffffff98;
  MMS mm_00;
  cTValue *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint local_24;
  cTValue *local_20;
  cTValue *local_18;
  
  if (((in_RSI->field_2).it == 0xfffffff5) || ((in_RDX->field_2).it == 0xfffffff5)) {
    pcVar4 = lj_cont_condt;
    if ((in_ECX & 1) != 0) {
      pcVar4 = lj_cont_condf;
    }
    pcVar5 = lj_meta_lookup((lua_State *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                            in_stack_ffffffffffffffa0,
                            (MMS)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    if ((pcVar5->field_2).it != 0xffffffff) {
      pTVar6 = mmcall(in_RDI,pcVar4,pcVar5,in_RSI,in_RDX);
      return pTVar6;
    }
  }
  else {
    local_24 = in_ECX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    if ((in_RSI->field_2).it == (in_RDX->field_2).it) {
      if (((in_RSI->field_2).it == 0xfffffffb) && ((in_RDX->field_2).it == 0xfffffffb)) {
        iVar1 = lj_str_cmp((GCstr *)(ulong)(in_RSI->u32).lo,(GCstr *)(ulong)(in_RDX->u32).lo);
        if ((in_ECX & 2) == 0) {
          bVar7 = iVar1 < 0;
        }
        else {
          bVar7 = iVar1 < 1;
        }
        local_84 = (uint)bVar7;
        return (TValue *)(long)(int)(local_84 ^ in_ECX & 1);
      }
    }
    else if ((((in_RSI->field_2).it != 0xfffffffe) && ((in_RSI->field_2).it != 0xfffffffd)) ||
            (((in_RDX->field_2).it != 0xfffffffe && ((in_RDX->field_2).it != 0xfffffffd))))
    goto LAB_001233b9;
    while( true ) {
      pcVar5 = local_18;
      mm_00 = (MMS)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      pcVar4 = lj_cont_condt;
      if ((local_24 & 1) != 0) {
        pcVar4 = lj_cont_condf;
      }
      uVar2 = 6;
      if ((local_24 & 2) != 0) {
        uVar2 = 7;
      }
      in_stack_ffffffffffffffa0 =
           lj_meta_lookup((lua_State *)CONCAT44(uVar2,in_stack_ffffffffffffffa8),
                          in_stack_ffffffffffffffa0,mm_00);
      in_stack_ffffffffffffff98 =
           lj_meta_lookup((lua_State *)CONCAT44(uVar2,in_stack_ffffffffffffffa8),
                          in_stack_ffffffffffffffa0,mm_00);
      if (((in_stack_ffffffffffffffa0->field_2).it != 0xffffffff) &&
         (iVar3 = lj_obj_equal(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98), iVar3 != 0)) {
        pTVar6 = mmcall(in_RDI,pcVar4,in_stack_ffffffffffffffa0,local_18,local_20);
        return pTVar6;
      }
      if ((local_24 & 2) == 0) break;
      local_18 = local_20;
      local_20 = pcVar5;
      local_24 = local_24 ^ 3;
      in_stack_ffffffffffffff90 = pcVar5;
    }
  }
LAB_001233b9:
  lj_err_comp((lua_State *)&in_stack_ffffffffffffffa0->field_2,in_stack_ffffffffffffff98,
              in_stack_ffffffffffffff90);
}

Assistant:

TValue *lj_meta_comp(lua_State *L, cTValue *o1, cTValue *o2, int op)
{
  if (LJ_HASFFI && (tviscdata(o1) || tviscdata(o2))) {
    ASMFunction cont = (op & 1) ? lj_cont_condf : lj_cont_condt;
    MMS mm = (op & 2) ? MM_le : MM_lt;
    cTValue *mo = lj_meta_lookup(L, tviscdata(o1) ? o1 : o2, mm);
    if (LJ_UNLIKELY(tvisnil(mo))) goto err;
    return mmcall(L, cont, mo, o1, o2);
  } else if (LJ_52 || itype(o1) == itype(o2)) {
    /* Never called with two numbers. */
    if (tvisstr(o1) && tvisstr(o2)) {
      int32_t res = lj_str_cmp(strV(o1), strV(o2));
      return (TValue *)(intptr_t)(((op&2) ? res <= 0 : res < 0) ^ (op&1));
    } else {
    trymt:
      while (1) {
	ASMFunction cont = (op & 1) ? lj_cont_condf : lj_cont_condt;
	MMS mm = (op & 2) ? MM_le : MM_lt;
	cTValue *mo = lj_meta_lookup(L, o1, mm);
#if LJ_52
	if (tvisnil(mo) && tvisnil((mo = lj_meta_lookup(L, o2, mm))))
#else
	cTValue *mo2 = lj_meta_lookup(L, o2, mm);
	if (tvisnil(mo) || !lj_obj_equal(mo, mo2))
#endif
	{
	  if (op & 2) {  /* MM_le not found: retry with MM_lt. */
	    cTValue *ot = o1; o1 = o2; o2 = ot;  /* Swap operands. */
	    op ^= 3;  /* Use LT and flip condition. */
	    continue;
	  }
	  goto err;
	}
	return mmcall(L, cont, mo, o1, o2);
      }
    }
  } else if (tvisbool(o1) && tvisbool(o2)) {
    goto trymt;
  } else {
  err:
    lj_err_comp(L, o1, o2);
    return NULL;
  }
}